

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fputc.c
# Opt level: O1

int fputc(int __c,FILE *__stream)

{
  char *pcVar1;
  int iVar2;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar2 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__stream);
  if (iVar2 == -1) {
    __c = 0xffffffff;
  }
  else {
    pcVar1 = __stream->_IO_read_base;
    __stream->_IO_read_base = pcVar1 + 1;
    __stream->_IO_read_ptr[(long)pcVar1] = (char)__c;
    if (__stream->_IO_read_base != __stream->_IO_read_end) {
      if ((((ulong)__stream->_IO_buf_end & 0x400000000) == 0) &&
         ((char)__c != '\n' || ((ulong)__stream->_IO_buf_end & 0x200000000) == 0))
      goto LAB_00103bd2;
    }
    iVar2 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
    __c = __c | -(uint)(iVar2 != 0);
  }
LAB_00103bd2:
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return __c;
}

Assistant:

int fputc( int c, struct _PDCLIB_file_t * stream )
{
    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    stream->buffer[stream->bufidx++] = ( char )c;

    if ( ( stream->bufidx == stream->bufsize )                   /* _IOFBF */
           || ( ( stream->status & _IOLBF ) && ( ( char )c == '\n' ) ) /* _IOLBF */
           || ( stream->status & _IONBF )                        /* _IONBF */
       )
    {
        /* buffer filled, unbuffered stream, or end-of-line. */
        c = ( _PDCLIB_flushbuffer( stream ) == 0 ) ? c : EOF;
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return c;
}